

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

uint8_t * av1_get_obmc_mask(int length)

{
  int length_local;
  uint8_t *local_8;
  
  switch(length) {
  case 1:
    local_8 = "@";
    break;
  case 2:
    local_8 = "-@";
    break;
  default:
    local_8 = (uint8_t *)0x0;
    break;
  case 4:
    local_8 = "\'2;@";
    break;
  case 8:
    local_8 = "$*059=@@";
    break;
  case 0x10:
    local_8 = "\"%(+.1468:<=@@@@";
    break;
  case 0x20:
    local_8 = "!#$&()+,-/02345789:;<<=>@@@@@@@@";
    break;
  case 0x40:
    local_8 = "!\"##$%&\'(()*+,,,-.//0123334456788899::;<<<<<=>>>>>????@@@@@@@@@@";
  }
  return local_8;
}

Assistant:

const uint8_t *av1_get_obmc_mask(int length) {
  switch (length) {
    case 1: return obmc_mask_1;
    case 2: return obmc_mask_2;
    case 4: return obmc_mask_4;
    case 8: return obmc_mask_8;
    case 16: return obmc_mask_16;
    case 32: return obmc_mask_32;
    case 64: return obmc_mask_64;
    default: assert(0); return NULL;
  }
}